

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O1

void __thiscall Runner::run(Runner *this)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar2;
  undefined4 uVar3;
  ScheduleHandle schedule;
  Optimizer optimizer;
  ScheduleHandle local_58;
  undefined1 local_48 [32];
  Optimizer local_28;
  
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Schedule::fromFile((pair<std::shared_ptr<Schedule>,_int> *)local_48,&this->input);
  uVar2 = local_48._8_8_;
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48._0_8_;
  this_00._M_pi =
       local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  uVar3 = local_48._16_4_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  local_28.limit = this->limit;
  pcVar1 = (this->input)._M_dataplus._M_p;
  Optimizer::name_abi_cxx11_((string *)local_48,&local_28);
  printf("Running case %s (%d operators) with %s ... \n",pcVar1,(ulong)(uint)uVar3,local_48._0_8_);
  if ((element_type *)local_48._0_8_ != (element_type *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_,CONCAT44(local_48._20_4_,local_48._16_4_) + 1);
  }
  Optimizer::optimize(&local_28,&local_58,&this->output);
  if (local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void run() {
        ScheduleHandle schedule;
        int count;
        std::tie(schedule, count) = Schedule::fromFile(input);
        auto optimizer = Optimizer(limit);
        printf("Running case %s (%d operators) with %s ... \n", input.c_str(), count, optimizer.name().c_str());
        optimizer.optimize(schedule, output);
    }